

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O1

int ogg_sync_pageout(ogg_sync_state *oy,ogg_page *og)

{
  bool bVar1;
  long lVar2;
  int unaff_EBP;
  
  if (oy->storage < 0) {
    unaff_EBP = 0;
  }
  else {
    do {
      lVar2 = ogg_sync_pageseek(oy,og);
      bVar1 = false;
      if (lVar2 < 1) {
        if (lVar2 == 0) {
          unaff_EBP = 0;
        }
        else {
          bVar1 = true;
          if (oy->unsynced == 0) {
            oy->unsynced = 1;
            unaff_EBP = -1;
            bVar1 = false;
          }
        }
      }
      else {
        unaff_EBP = 1;
        bVar1 = false;
      }
    } while (bVar1);
  }
  return unaff_EBP;
}

Assistant:

int ogg_sync_pageout(ogg_sync_state *oy, ogg_page *og){

  if(ogg_sync_check(oy))return 0;

  /* all we need to do is verify a page at the head of the stream
     buffer.  If it doesn't verify, we look for the next potential
     frame */

  for(;;){
    long ret=ogg_sync_pageseek(oy,og);
    if(ret>0){
      /* have a page */
      return(1);
    }
    if(ret==0){
      /* need more data */
      return(0);
    }

    /* head did not start a synced page... skipped some bytes */
    if(!oy->unsynced){
      oy->unsynced=1;
      return(-1);
    }

    /* loop. keep looking */

  }
}